

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O0

void AdditionHelper<long,unsigned_int,12>::
     AdditionThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (long *lhs,uint *rhs,long *result)

{
  long *in_RDX;
  uint *in_RSI;
  long *in_RDI;
  uint64_t tmp;
  
  if (*in_RDI <= (long)(*in_RDI + (ulong)*in_RSI)) {
    *in_RDX = *in_RDI + (ulong)*in_RSI;
    return;
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

TestVector() : test_cases(nullptr), count(0), current(0) {}